

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O2

uchar rlib::midi::Smf::Inner::read<unsigned_char_const>(istream *is)

{
  long lVar1;
  undefined7 in_register_00000001;
  runtime_error *this;
  type_conflict6 buf;
  
  buf = (type_conflict6)((uint7)in_register_00000001 >> 0x30);
  lVar1 = std::istream::read((char *)is,(long)&buf);
  if (*(long *)(lVar1 + 8) != 0) {
    return buf;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"size error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T read(std::istream& is) {
		typename std::remove_const<T>::type buf;
		if (is.read(reinterpret_cast<char*>(&buf), sizeof(buf)).gcount() < sizeof(buf)) {
			throw std::runtime_error("size error");
		}
		return buf;
	}